

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# read.c
# Opt level: O3

void forget_levels(int percent)

{
  int iVar1;
  xchar xVar2;
  xchar xVar3;
  xchar xVar4;
  int count;
  undefined1 *puVar5;
  level *plVar6;
  long lVar7;
  trap *ptVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  int indices [512];
  int local_838 [514];
  
  if (percent != 0) {
    if (percent - 0x65U < 0xffffff9c) {
      impossible("forget_levels: bad percent %d",(ulong)(uint)percent);
      return;
    }
    xVar2 = ledger_no(&u.uz);
    xVar3 = maxledgerno();
    if (xVar3 < '\0') {
      count = 0;
    }
    else {
      uVar10 = 0;
      count = 0;
      do {
        if (((levels[uVar10] != (level *)0x0) && (((levels[uVar10]->flags).field_0xa & 0x40) == 0))
           && ((uint)(int)xVar2 != uVar10)) {
          xVar4 = ledger_to_dnum((xchar)uVar10);
          if (xVar4 == dungeon_topology.d_sokoban_dnum) {
            percent = percent + 2;
          }
          else {
            lVar7 = (long)count;
            count = count + 1;
            local_838[lVar7] = (int)uVar10;
          }
        }
        uVar10 = uVar10 + 1;
      } while ((byte)(xVar3 + 1) != uVar10);
    }
    iVar11 = 100;
    if (percent < 100) {
      iVar11 = percent;
    }
    randomize(local_838,count);
    if (0x31 < iVar11 * count) {
      uVar10 = 0;
      do {
        iVar1 = local_838[uVar10];
        puVar5 = &(levels[iVar1]->flags).field_0x8;
        *(uint *)puVar5 = *(uint *)puVar5 | 0x400000;
        plVar6 = levels[iVar1];
        if ((plVar6->z).dnum != dungeon_topology.d_sokoban_dnum) {
          puVar5 = &plVar6->locations[0][0].field_0x6;
          lVar7 = 0;
          do {
            lVar9 = 0;
            do {
              puVar5[lVar9 + -1] = 0;
              *(undefined4 *)(puVar5 + lVar9 + -6) = 0;
              *(uint *)(puVar5 + lVar9) = *(uint *)(puVar5 + lVar9) & 0xfffff7f3;
              lVar9 = lVar9 + 0xc;
            } while (lVar9 != 0xfc);
            lVar7 = lVar7 + 1;
            puVar5 = puVar5 + 0xfc;
          } while (lVar7 != 0x50);
          plVar6 = levels[iVar1];
        }
        xVar3 = u.uy;
        xVar2 = u.ux;
        ptVar8 = plVar6->lev_traps;
        if (ptVar8 != (trap *)0x0) {
          do {
            if (((ptVar8->tx != xVar2) || (ptVar8->ty != xVar3)) &&
               ((ptVar8->field_0x8 & 0x1f) != 0xd)) {
              ptVar8->field_0x8 = ptVar8->field_0x8 & 0xdf;
            }
            ptVar8 = ptVar8->ntrap;
          } while (ptVar8 != (trap *)0x0);
          plVar6 = levels[iVar1];
        }
        plVar6->levname[0] = '\0';
        uVar10 = uVar10 + 1;
      } while (uVar10 != (ulong)(iVar11 * count + 0x32) / 100);
    }
  }
  return;
}

Assistant:

void forget_levels(int percent)
{
	int i, count;
	xchar  maxl, this_lev;
	int indices[MAXLINFO];

	if (percent == 0) return;

	if (percent <= 0 || percent > 100) {
	    impossible("forget_levels: bad percent %d", percent);
	    return;
	}

	this_lev = ledger_no(&u.uz);
	maxl = maxledgerno();

	/* count & save indices of non-forgotten visited levels */
	/* Sokoban levels are pre-mapped for the player, and should stay
	 * so, or they become nearly impossible to solve.  But try to
	 * shift the forgetting elsewhere by fiddling with percent
	 * instead of forgetting fewer levels.
	 */
	for (count = 0, i = 0; i <= maxl; i++)
	    if ((levels[i] && !levels[i]->flags.forgotten) && i != this_lev) {
		if (ledger_to_dnum(i) == sokoban_dnum)
		    percent += 2;
		else
		    indices[count++] = i;
	    }
	
	if (percent > 100) percent = 100;

	randomize(indices, count);

	/* forget first % of randomized indices */
	count = ((count * percent) + 50) / 100;
	for (i = 0; i < count; i++) {
	    levels[indices[i]]->flags.forgotten = TRUE;
	    forget_map(levels[indices[i]], TRUE);
	    forget_traps(levels[indices[i]]);
	    levels[indices[i]]->levname[0] = '\0';
	}
}